

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::FilterCase::iterate(FilterCase *this)

{
  allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter> *this_00;
  bool bVar1;
  deBool dVar2;
  int iVar3;
  deUint32 dVar4;
  uint uVar5;
  NotSupportedError *this_01;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  char *str;
  CommandLine *this_02;
  uchar *tbs;
  size_t tbslen;
  allocator<char> local_171;
  string local_170;
  allocator<char> local_149;
  string local_148;
  vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
  local_128;
  undefined1 local_110 [8];
  vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
  filteredMessages;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
  local_f0;
  undefined1 local_d8 [8];
  vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
  filters;
  undefined1 auStack_b8 [4];
  deUint32 baseSeed;
  pointer puStack_b0;
  pointer local_a8;
  undefined1 local_98 [8];
  MessageFilter baseFilter;
  string local_60;
  undefined1 local_40 [8];
  vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
  refMessages;
  Functions *gl;
  FilterCase *this_local;
  
  while ((dVar2 = ::deGetFalse(), dVar2 == 0 &&
         (bVar1 = isKHRDebugSupported((this->super_BaseCase).super_ErrorCase.super_TestCase.
                                      m_context), bVar1))) {
    dVar2 = ::deGetFalse();
    if (dVar2 == 0) {
      pRVar6 = Context::getRenderContext
                         ((this->super_BaseCase).super_ErrorCase.super_TestCase.m_context);
      iVar3 = (*pRVar6->_vptr_RenderContext[3])();
      refMessages.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT44(extraout_var,iVar3);
      (**(code **)&refMessages.
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage[0x1f].message)(0x92e0);
      (**(code **)&refMessages.
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage[0x1f].message)(0x8242);
      (**(code **)&refMessages.
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage[0x16].id)
                (BaseCase::callbackHandle,this);
      (**(code **)&refMessages.
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage[0x16].id.id)
                (0x1100,0x1100,0x1100,0,0,1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_60,"Reference run",(allocator<char> *)&baseFilter.field_0x2f);
      genMessages((vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
                   *)local_40,this,true,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      std::allocator<char>::~allocator((allocator<char> *)&baseFilter.field_0x2f);
      _auStack_b8 = (pointer)0x0;
      puStack_b0 = (pointer)0x0;
      local_a8 = (pointer)0x0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_b8);
      MessageFilter::MessageFilter
                ((MessageFilter *)local_98,0x1100,0x1100,0x1100,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_b8,true);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_b8);
      str = tcu::TestNode::getName((TestNode *)this);
      dVar4 = deStringHash(str);
      this_02 = tcu::TestContext::getCommandLine
                          ((this->super_BaseCase).super_ErrorCase.super_TestCase.super_TestCase.
                           super_TestNode.m_testCtx);
      uVar5 = tcu::CommandLine::getBaseSeed(this_02);
      filters.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = dVar4 ^ uVar5;
      this_00 = (allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>
                 *)((long)&filteredMessages.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
      std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>::
      allocator(this_00);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
      ::vector(&local_f0,1,(value_type *)local_98,this_00);
      tbs = (uchar *)(ulong)filters.
                            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
      tbslen = 4;
      genFilters((vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                  *)local_d8,this,
                 (vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
                  *)local_40,&local_f0,
                 filters.
                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,4);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
      ::~vector(&local_f0);
      std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>::
      ~allocator((allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>
                  *)((long)&filteredMessages.
                            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
      ::vector((vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
                *)local_110);
      applyFilters(this,(vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                         *)local_d8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_148,"Filtered run",&local_149);
      genMessages(&local_128,this,false,&local_148);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
      ::operator=((vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
                   *)local_110,&local_128);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
      ::~vector(&local_128);
      std::__cxx11::string::~string((string *)&local_148);
      std::allocator<char>::~allocator(&local_149);
      verify(this,(EVP_PKEY_CTX *)local_40,(uchar *)local_110,(size_t)local_d8,tbs,tbslen);
      bVar1 = BaseCase::isDebugContext(&this->super_BaseCase);
      if ((!bVar1) &&
         (bVar1 = std::
                  vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
                  ::empty((vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
                           *)local_40), bVar1)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_170,"Verification accuracy is lacking without a debug context",
                   &local_171);
        tcu::ResultCollector::addResult
                  (&(this->super_BaseCase).m_results,QP_TEST_RESULT_QUALITY_WARNING,&local_170);
        std::__cxx11::string::~string((string *)&local_170);
        std::allocator<char>::~allocator(&local_171);
      }
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
      ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
                 *)local_110);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
      ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                 *)local_d8);
      MessageFilter::~MessageFilter((MessageFilter *)local_98);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
      ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
                 *)local_40);
      (**(code **)&refMessages.
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage[0x1a].id.id)(0x92e0);
      (**(code **)&refMessages.
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage[0x16].id)(0);
      tcu::ResultCollector::setTestContextResult
                (&(this->super_BaseCase).m_results,
                 (this->super_BaseCase).super_ErrorCase.super_TestCase.super_TestCase.super_TestNode
                 .m_testCtx);
      return STOP;
    }
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_01,"GL_KHR_debug is not supported","isKHRDebugSupported(m_context)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDebugTests.cpp"
             ,0x3a6);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

FilterCase::IterateResult FilterCase::iterate (void)
{
	TCU_CHECK_AND_THROW(NotSupportedError, isKHRDebugSupported(m_context), "GL_KHR_debug is not supported");

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.enable(GL_DEBUG_OUTPUT);
	gl.enable(GL_DEBUG_OUTPUT_SYNCHRONOUS);
	gl.debugMessageCallback(callbackHandle, this);

	try
	{
		gl.debugMessageControl(GL_DONT_CARE, GL_DONT_CARE, GL_DONT_CARE, 0, DE_NULL, true);

		{
			const vector<MessageData>	refMessages		= genMessages(true, "Reference run");
			const MessageFilter			baseFilter		(GL_DONT_CARE, GL_DONT_CARE, GL_DONT_CARE, vector<GLuint>(), true);
			const deUint32				baseSeed		= deStringHash(getName()) ^ m_testCtx.getCommandLine().getBaseSeed();
			const vector<MessageFilter>	filters			= genFilters(refMessages, vector<MessageFilter>(1, baseFilter), baseSeed, 4);
			vector<MessageData>			filteredMessages;

			applyFilters(filters);

			// Generate errors
			filteredMessages = genMessages(false, "Filtered run");

			// Verify
			verify(refMessages, filteredMessages, filters);

			if (!isDebugContext() && refMessages.empty())
				m_results.addResult(QP_TEST_RESULT_QUALITY_WARNING, "Verification accuracy is lacking without a debug context");
		}
	}
	catch (...)
	{
		gl.disable(GL_DEBUG_OUTPUT);
		gl.debugMessageCallback(DE_NULL, DE_NULL);
		throw;
	}

	gl.disable(GL_DEBUG_OUTPUT);
	gl.debugMessageCallback(DE_NULL, DE_NULL);
	m_results.setTestContextResult(m_testCtx);

	return STOP;
}